

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O0

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_presult::read
          (ZipkinCollector_submitZipkinBatch_presult *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  undefined4 in_register_00000034;
  uint local_68;
  TType local_64;
  uint32_t _i40;
  TType _etype39;
  uint32_t _size36;
  short local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  ZipkinCollector_submitZipkinBatch_presult *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  while( true ) {
    uVar1 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    if (local_4e == 0) {
      if (local_4c == T_LIST) {
        std::
        vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
        ::clear(this->success);
        uVar1 = apache::thrift::protocol::TProtocol::readListBegin(tracker.prot_,&local_64,&_i40);
        fname.field_2._12_4_ = fname.field_2._12_4_ + uVar1;
        std::
        vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
        ::resize(this->success,(ulong)_i40);
        for (local_68 = 0; local_68 < _i40; local_68 = local_68 + 1) {
          pvVar4 = std::
                   vector<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                   ::operator[](this->success,(ulong)local_68);
          iVar2 = (**(code **)(*(long *)pvVar4 + 0x10))(pvVar4,tracker.prot_);
          fname.field_2._12_4_ = iVar2 + fname.field_2._12_4_;
        }
        uVar1 = apache::thrift::protocol::TProtocol::readListEnd(tracker.prot_);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->__isset =
             (_ZipkinCollector_submitZipkinBatch_presult__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
    }
    else {
      uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    }
    uVar1 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar3 = uVar1 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar3;
  std::__cxx11::string::~string((string *)local_48);
  apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
  return (ulong)uVar3;
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_presult::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            (*(this->success)).clear();
            uint32_t _size36;
            ::apache::thrift::protocol::TType _etype39;
            xfer += iprot->readListBegin(_etype39, _size36);
            (*(this->success)).resize(_size36);
            uint32_t _i40;
            for (_i40 = 0; _i40 < _size36; ++_i40)
            {
              xfer += (*(this->success))[_i40].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}